

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall
gmlc::networking::TcpServer::handle_accept(TcpServer *this,pointer *acc,pointer *new_connection)

{
  __int_type_conflict1 _Var1;
  TcpConnection *pTVar2;
  element_type *peVar3;
  TcpAcceptor *this_00;
  int iVar4;
  mutex *__m;
  unique_lock<std::mutex> lock;
  undefined1 local_a0 [16];
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_90;
  function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
  local_70;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  local_50;
  
  std::__shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2> *)&lock,
             &(((new_connection->
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->socket_).
              super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(((lock._M_device)->super___mutex_base)._M_mutex.__align + 0x70))(lock._M_device,1,0);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lock._M_owns);
  std::__shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2> *)&lock,
             &(((new_connection->
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->socket_).
              super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>);
  iVar4 = 1;
  (**(code **)(((lock._M_device)->super___mutex_base)._M_mutex.__align + 0x60))();
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lock._M_owns);
  pTVar2 = (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((this->halted)._M_base._M_i & 1U) == 0) {
    peVar3 = (pTVar2->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar3->handshake_server_ = true;
    (*peVar3->_vptr_Socket[6])();
    pTVar2 = (new_connection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::
    function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
    ::function(&local_50,&this->dataCall);
    TcpConnection::setDataCall(pTVar2,&local_50);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_50);
    pTVar2 = (new_connection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
    ::function(&local_70,&this->errorCall);
    TcpConnection::setErrorCall(pTVar2,&local_70);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_70);
    if ((this->logFunction).super__Function_base._M_manager != (_Manager_type)0x0) {
      pTVar2 = (new_connection->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)(local_a0 + 0x10),&this->logFunction);
      TcpConnection::setLoggingFunction
                (pTVar2,(function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)(local_a0 + 0x10));
      CLI::std::_Function_base::~_Function_base((_Function_base *)(local_a0 + 0x10));
    }
    TcpConnection::startReceive
              ((new_connection->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    __m = &this->accepting;
    std::unique_lock<std::mutex>::unique_lock(&lock,__m);
    iVar4 = (int)__m;
    _Var1 = (this->halted)._M_base._M_i;
    if ((_Var1 & 1U) == 0) {
      std::
      vector<std::shared_ptr<gmlc::networking::TcpConnection>,std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>>>
      ::emplace_back<std::shared_ptr<gmlc::networking::TcpConnection>>
                ((vector<std::shared_ptr<gmlc::networking::TcpConnection>,std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>>>
                  *)&this->connections,new_connection);
    }
    else {
      std::unique_lock<std::mutex>::unlock(&lock);
      TcpConnection::close
                ((new_connection->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,iVar4);
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    if ((_Var1 & 1U) == 0) {
      this_00 = (acc->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>)
                ._M_ptr;
      TcpConnection::create
                ((TcpConnection *)local_a0,&this->socket_factory,this->ioctx,this->bufferSize);
      TcpAcceptor::start(this_00,(pointer *)local_a0);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
    }
  }
  else {
    TcpConnection::close(pTVar2,iVar4);
  }
  return;
}

Assistant:

void TcpServer::handle_accept(
    TcpAcceptor::pointer acc,
    TcpConnection::pointer new_connection)
{
    /*setting linger to 1 second*/
    new_connection->socket()->set_option_linger(true, 0);
    new_connection->socket()->set_option_no_delay(true);
    // Set options here
    if (halted.load()) {
        new_connection->close();
        return;
    }

    new_connection->setHandshakeModeServer();
    new_connection->handshake();

    new_connection->setDataCall(dataCall);
    new_connection->setErrorCall(errorCall);
    if (logFunction) {
        new_connection->setLoggingFunction(logFunction);
    }
    new_connection->startReceive();
    {  // scope for the lock_guard

        std::unique_lock<std::mutex> lock(accepting);
        if (!halted.load()) {
            connections.push_back(std::move(new_connection));
        } else {
            lock.unlock();
            new_connection->close();
            return;
        }
    }
    acc->start(TcpConnection::create(socket_factory, ioctx, bufferSize));
}